

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O3

void __thiscall cmState::AddBuiltinCommand(cmState *this,string *name,Command *command)

{
  size_t __n;
  int iVar1;
  iterator iVar2;
  string local_40;
  
  cmsys::SystemTools::LowerCase(&local_40,name);
  __n = name->_M_string_length;
  if (__n == local_40._M_string_length) {
    if (__n != 0) {
      iVar1 = bcmp((name->_M_dataplus)._M_p,local_40._M_dataplus._M_p,__n);
      if (iVar1 != 0) goto LAB_001dfc53;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    iVar2 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->BuiltinCommands)._M_h,name);
    if (iVar2.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<bool(std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>const&,cmExecutionStatus&)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<bool(std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>const&,cmExecutionStatus&)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _M_emplace<std::__cxx11::string_const&,std::function<bool(std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>const&,cmExecutionStatus&)>>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<bool(std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>const&,cmExecutionStatus&)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<bool(std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>const&,cmExecutionStatus&)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&this->BuiltinCommands,name,command);
      return;
    }
    __assert_fail("this->BuiltinCommands.find(name) == this->BuiltinCommands.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmState.cxx"
                  ,0x192,"void cmState::AddBuiltinCommand(const std::string &, Command)");
  }
LAB_001dfc53:
  __assert_fail("name == cmSystemTools::LowerCase(name)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmState.cxx"
                ,0x191,"void cmState::AddBuiltinCommand(const std::string &, Command)");
}

Assistant:

void cmState::AddBuiltinCommand(std::string const& name, Command command)
{
  assert(name == cmSystemTools::LowerCase(name));
  assert(this->BuiltinCommands.find(name) == this->BuiltinCommands.end());
  this->BuiltinCommands.emplace(name, std::move(command));
}